

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O2

HT_Boolean ht_task_scheduler_remove_task(HT_TaskScheduler *task_scheduler,HT_TaskId task_id)

{
  void *ptr;
  ulong uVar1;
  ulong uVar2;
  size_t i;
  
  if (task_id < 0) {
    return 0;
  }
  uVar1 = (task_scheduler->tasks).size;
  uVar2 = 0;
  do {
    if (uVar1 == uVar2) {
      return 0;
    }
    ptr = (task_scheduler->tasks).data[uVar2];
    uVar2 = uVar2 + 1;
  } while (*(int *)((long)ptr + 0x20) != task_id);
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    if ((task_scheduler->tasks).data[uVar2] == ptr) {
      ht_bag_void_ptr_remove_nth(&task_scheduler->tasks,uVar2);
      uVar1 = (task_scheduler->tasks).size;
    }
  }
  ht_free(ptr);
  return 1;
}

Assistant:

HT_Boolean
ht_task_scheduler_remove_task(HT_TaskScheduler* task_scheduler, HT_TaskId task_id)
{
    size_t i;

    if (task_id < 0)
    {
        return HT_FALSE;
    }

    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        HT_Task* task = HT_TASK(task_scheduler->tasks.data[i]);
        if (task->id == task_id)
        {
            ht_task_scheduler_remove_task_entry(&task_scheduler->tasks, task);
            ht_free(task);
            return HT_TRUE;
        }
    }

    return HT_FALSE;
}